

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.h
# Opt level: O2

DeepFrameBuffer * __thiscall
Imf_3_4::DeepFrameBuffer::operator=(DeepFrameBuffer *this,DeepFrameBuffer *param_1)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)this,(_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                       *)param_1);
  uVar5 = *(undefined4 *)&(param_1->_sampleCounts).field_0x4;
  pcVar1 = (param_1->_sampleCounts).base;
  sVar2 = (param_1->_sampleCounts).xStride;
  sVar3 = (param_1->_sampleCounts).yStride;
  iVar6 = (param_1->_sampleCounts).xSampling;
  iVar7 = (param_1->_sampleCounts).ySampling;
  dVar4 = (param_1->_sampleCounts).fillValue;
  (this->_sampleCounts).type = (param_1->_sampleCounts).type;
  *(undefined4 *)&(this->_sampleCounts).field_0x4 = uVar5;
  (this->_sampleCounts).base = pcVar1;
  (this->_sampleCounts).xStride = sVar2;
  (this->_sampleCounts).yStride = sVar3;
  (this->_sampleCounts).xSampling = iVar6;
  (this->_sampleCounts).ySampling = iVar7;
  (this->_sampleCounts).fillValue = dVar4;
  bVar8 = (param_1->_sampleCounts).yTileCoords;
  (this->_sampleCounts).xTileCoords = (param_1->_sampleCounts).xTileCoords;
  (this->_sampleCounts).yTileCoords = bVar8;
  return this;
}

Assistant:

class IMF_EXPORT_TYPE DeepFrameBuffer
{
public:
    //------------
    // Add a slice
    //------------

    IMF_EXPORT
    void insert (const char name[], const DeepSlice& slice);

    IMF_EXPORT
    void insert (const std::string& name, const DeepSlice& slice);

    //----------------------------------------------------------------
    // Access to existing slices:
    //
    // [n]              Returns a reference to the slice with name n.
    //                  If no slice with name n exists, an IEX_NAMESPACE::ArgExc
    //                  is thrown.
    //
    // findSlice(n)     Returns a pointer to the slice with name n,
    //                  or 0 if no slice with name n exists.
    //
    //----------------------------------------------------------------

    IMF_EXPORT
    DeepSlice& operator[] (const char name[]);
    IMF_EXPORT
    const DeepSlice& operator[] (const char name[]) const;

    IMF_EXPORT
    DeepSlice& operator[] (const std::string& name);
    IMF_EXPORT
    const DeepSlice& operator[] (const std::string& name) const;

    IMF_EXPORT
    DeepSlice* findSlice (const char name[]);
    IMF_EXPORT
    const DeepSlice* findSlice (const char name[]) const;

    IMF_EXPORT
    DeepSlice* findSlice (const std::string& name);
    IMF_EXPORT
    const DeepSlice* findSlice (const std::string& name) const;

    //-----------------------------------------
    // Iterator-style access to existing slices
    //-----------------------------------------

    typedef std::map<Name, DeepSlice> SliceMap;

    class Iterator;
    class ConstIterator;

    IMF_EXPORT
    Iterator begin ();
    IMF_EXPORT
    ConstIterator begin () const;

    IMF_EXPORT
    Iterator end ();
    IMF_EXPORT
    ConstIterator end () const;

    IMF_EXPORT
    Iterator find (const char name[]);
    IMF_EXPORT
    ConstIterator find (const char name[]) const;

    IMF_EXPORT
    Iterator find (const std::string& name);
    IMF_EXPORT
    ConstIterator find (const std::string& name) const;

    //----------------------------------------------------
    // Public function for accessing a sample count slice.
    //----------------------------------------------------

    IMF_EXPORT
    void insertSampleCountSlice (const Slice& slice);
    IMF_EXPORT
    const Slice& getSampleCountSlice () const;

private:
    SliceMap _map;
    Slice    _sampleCounts;
}